

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O2

void __thiscall FNodeBuilder::AddPolySegs(FNodeBuilder *this,FPolySeg *segs,int numsegs)

{
  double *pdVar1;
  long *plVar2;
  FPrivVert *pFVar3;
  uint uVar4;
  long lVar5;
  FPrivSeg seg;
  FPrivSeg local_88;
  undefined8 local_40 [2];
  
  if (numsegs < 1) {
    __assert_fail("numsegs > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/nodebuild_utility.cpp"
                  ,0xf4,"void FNodeBuilder::AddPolySegs(FPolySeg *, int)");
  }
  lVar5 = 0;
  while( true ) {
    if ((ulong)(uint)numsegs * 0x28 - lVar5 == 0) {
      return;
    }
    local_88.next = 0xffffffff;
    local_88.loopnum = 0;
    local_88.partner = 0xffffffff;
    local_88.hashnext = (FPrivSeg *)0x0;
    local_88.planefront = false;
    local_88.storedseg = 0xffffffff;
    local_88.planenum = -1;
    plVar2 = *(long **)((long)&segs->wall + lVar5);
    if (plVar2 == (long *)0x0) break;
    local_88.frontsector = (sector_t *)*plVar2;
    local_88.backsector = *(sector_t **)(plVar2[0x14] + 0x78);
    if (local_88.backsector == local_88.frontsector) {
      local_88.backsector = *(sector_t **)(plVar2[0x14] + 0x80);
    }
    pdVar1 = (double *)((long)&(segs->v1).pos.X + lVar5);
    local_40[0] = CONCAT44(SUB84(pdVar1[1] + 103079215104.0,0),SUB84(*pdVar1 + 103079215104.0,0));
    local_88.v1 = (*this->VertexMap->_vptr_IVertexMap[2])(this->VertexMap,local_40);
    pdVar1 = (double *)((long)&(segs->v2).pos.X + lVar5);
    local_40[0] = CONCAT44(SUB84(pdVar1[1] + 103079215104.0,0),SUB84(*pdVar1 + 103079215104.0,0));
    local_88.v2 = (*this->VertexMap->_vptr_IVertexMap[2])(this->VertexMap,local_40);
    local_88.linedef = (int)((plVar2[0x14] - (long)this->Level->Lines) / 0x98);
    local_88.sidedef = (int)(((long)plVar2 - (long)this->Level->Sides) / 0xd8);
    pFVar3 = (this->Vertices).Array;
    local_88.nextforvert = pFVar3[local_88.v1].segs;
    local_88.nextforvert2 = pFVar3[local_88.v2].segs2;
    uVar4 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::Push(&this->Segs,&local_88);
    pFVar3 = (this->Vertices).Array;
    pFVar3[local_88.v1].segs = uVar4;
    pFVar3[local_88.v2].segs2 = uVar4;
    lVar5 = lVar5 + 0x28;
  }
  __assert_fail("side != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/nodebuild_utility.cpp"
                ,0x105,"void FNodeBuilder::AddPolySegs(FPolySeg *, int)");
}

Assistant:

void FNodeBuilder::AddPolySegs(FPolySeg *segs, int numsegs)
{
	assert(numsegs > 0);

	for (int i = 0; i < numsegs; ++i)
	{
		FPrivSeg seg;
		FPrivVert vert;
		int segnum;

		seg.next = DWORD_MAX;
		seg.loopnum = 0;
		seg.partner = DWORD_MAX;
		seg.hashnext = NULL;
		seg.planefront = false;
		seg.planenum = DWORD_MAX;
		seg.storedseg = DWORD_MAX;

		side_t *side = segs[i].wall;
		assert(side != NULL);

		seg.frontsector = side->sector;
		seg.backsector = side->linedef->frontsector == side->sector ? side->linedef->backsector : side->linedef->frontsector;
		vert.x = FLOAT2FIXED(segs[i].v1.pos.X);
		vert.y = FLOAT2FIXED(segs[i].v1.pos.Y);
		seg.v1 = VertexMap->SelectVertexExact(vert);
		vert.x = FLOAT2FIXED(segs[i].v2.pos.X);
		vert.y = FLOAT2FIXED(segs[i].v2.pos.Y);
		seg.v2 = VertexMap->SelectVertexExact(vert);
		seg.linedef = int(side->linedef - Level.Lines);
		seg.sidedef = int(side - Level.Sides);
		seg.nextforvert = Vertices[seg.v1].segs;
		seg.nextforvert2 = Vertices[seg.v2].segs2;

		segnum = (int)Segs.Push(seg);
		Vertices[seg.v1].segs = segnum;
		Vertices[seg.v2].segs2 = segnum;
	}
}